

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

bool __thiscall
irr::video::CImage::copyToNoScaling
          (CImage *this,void *target,u32 width,u32 height,ECOLOR_FORMAT format,u32 pitch)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  uint in_ECX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  ECOLOR_FORMAT in_R8D;
  uint in_R9D;
  double __x;
  u32 y;
  u32 rest;
  u32 bwidth;
  u8 *srcpos;
  u8 *tgtpos;
  u32 bpp;
  uint local_4c;
  void *local_40;
  void *local_38;
  uint local_28;
  bool local_1;
  
  bVar1 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI + 8));
  if (bVar1) {
    os::Printer::log((Printer *)
                     "IImage::copyToNoScaling method doesn\'t work with compressed images.",__x);
    local_1 = false;
  }
  else if ((((in_RSI == (void *)0x0) || (in_EDX == 0)) || (in_ECX == 0)) ||
          ((*(int *)(in_RDI + 0xc) == 0 || (*(int *)(in_RDI + 0x10) == 0)))) {
    local_1 = false;
  }
  else {
    uVar2 = IImage::getBitsPerPixelFromFormat(in_R8D);
    local_28 = in_R9D;
    if (in_R9D == 0) {
      local_28 = in_EDX * (uVar2 >> 3);
    }
    if (((*(ECOLOR_FORMAT *)(in_RDI + 8) == in_R8D) && (*(int *)(in_RDI + 0xc) == in_EDX)) &&
       (*(uint *)(in_RDI + 0x10) == in_ECX)) {
      if (local_28 == *(uint *)(in_RDI + 0x2c)) {
        memcpy(in_RSI,*(void **)(in_RDI + 0x18),(ulong)in_ECX * (ulong)local_28);
      }
      else {
        local_40 = *(void **)(in_RDI + 0x18);
        uVar3 = in_EDX * (uVar2 >> 3);
        local_38 = in_RSI;
        for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
          memcpy(local_38,local_40,(ulong)uVar3);
          memset((void *)((long)local_38 + (ulong)uVar3),0,(ulong)(local_28 - uVar3));
          local_38 = (void *)((long)local_38 + (ulong)local_28);
          local_40 = (void *)((long)local_40 + (ulong)*(uint *)(in_RDI + 0x2c));
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CImage::copyToNoScaling(void *target, u32 width, u32 height, ECOLOR_FORMAT format, u32 pitch) const
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToNoScaling method doesn't work with compressed images.", ELL_WARNING);
		return false;
	}

	if (!target || !width || !height || !Size.Width || !Size.Height)
		return false;

	const u32 bpp = getBitsPerPixelFromFormat(format) / 8;
	if (0 == pitch)
		pitch = width * bpp;

	if (!(Format == format && Size.Width == width && Size.Height == height))
		return false;

	if (pitch == Pitch) {
		memcpy(target, Data, (size_t)height * pitch);
	} else {
		u8 *tgtpos = (u8 *)target;
		u8 *srcpos = Data;
		const u32 bwidth = width * bpp;
		const u32 rest = pitch - bwidth;
		for (u32 y = 0; y < height; ++y) {
			// copy scanline
			memcpy(tgtpos, srcpos, bwidth);
			// clear pitch
			memset(tgtpos + bwidth, 0, rest);
			tgtpos += pitch;
			srcpos += Pitch;
		}
	}

	return true;
}